

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integercompressor.cpp
# Opt level: O0

void __thiscall
IntegerCompressor::IntegerCompressor
          (IntegerCompressor *this,ArithmeticDecoder *dec,U32 bits,U32 contexts,U32 bits_high,
          U32 range)

{
  uint local_28;
  U32 range_local;
  U32 bits_high_local;
  U32 contexts_local;
  U32 bits_local;
  ArithmeticDecoder *dec_local;
  IntegerCompressor *this_local;
  
  if (dec == (ArithmeticDecoder *)0x0) {
    __assert_fail("dec",
                  "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/integercompressor.cpp"
                  ,0x6f,
                  "IntegerCompressor::IntegerCompressor(ArithmeticDecoder *, U32, U32, U32, U32)");
  }
  this->enc = (ArithmeticEncoder *)0x0;
  this->dec = dec;
  this->bits = bits;
  this->contexts = contexts;
  this->bits_high = bits_high;
  this->range = range;
  if (range == 0) {
    if ((bits == 0) || (0x1f < bits)) {
      this->corr_bits = 0x20;
      this->corr_range = 0;
      this->corr_min = -0x80000000;
      this->corr_max = 0x7fffffff;
    }
    else {
      this->corr_bits = bits;
      this->corr_range = 1 << ((byte)bits & 0x1f);
      this->corr_min = -(this->corr_range >> 1);
      this->corr_max = this->corr_min + this->corr_range + -1;
    }
  }
  else {
    this->corr_bits = 0;
    this->corr_range = range;
    local_28 = range;
    while (local_28 != 0) {
      local_28 = local_28 >> 1;
      this->corr_bits = this->corr_bits + 1;
    }
    if (this->corr_range == 1 << ((char)this->corr_bits - 1U & 0x1f)) {
      this->corr_bits = this->corr_bits - 1;
    }
    this->corr_min = -(this->corr_range >> 1);
    this->corr_max = this->corr_min + this->corr_range + -1;
  }
  this->k = 0;
  this->mBits = (ArithmeticModel **)0x0;
  this->mCorrector = (ArithmeticModel **)0x0;
  return;
}

Assistant:

IntegerCompressor::IntegerCompressor(ArithmeticDecoder* dec, U32 bits, U32 contexts, U32 bits_high, U32 range)
{
  assert(dec);
  this->enc = 0;
  this->dec = dec;
  this->bits = bits;
  this->contexts = contexts;
  this->bits_high = bits_high;
  this->range = range;

  if (range) // the corrector's significant bits and range
  {
    corr_bits = 0;
    corr_range = range;
    while (range)
    {
      range = range >> 1;
      corr_bits++;
    }
    if (corr_range == (1u << (corr_bits-1)))
    {
      corr_bits--;
    }
		// the corrector must fall into this interval
    corr_min = -((I32)(corr_range/2));
  	corr_max = corr_min + corr_range - 1;
  }
  else if (bits && bits < 32)
  {
    corr_bits = bits;
    corr_range = 1u << bits;
		// the corrector must fall into this interval
    corr_min = -((I32)(corr_range/2));
  	corr_max = corr_min + corr_range - 1;
  }
	else
	{
    corr_bits = 32;
		corr_range = 0;
		// the corrector must fall into this interval
    corr_min = I32_MIN;
    corr_max = I32_MAX;
	}

  k = 0;

  mBits = 0;
  mCorrector = 0;
}